

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O1

int __thiscall
soplex::
LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::remove(LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,char *__filename)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  pointer pnVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int32_t iVar13;
  int extraout_EAX;
  int iVar14;
  DataKey local_30;
  
  iVar14 = (int)__filename;
  local_30 = (this->
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).set.thekey[iVar14];
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::remove(&this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,(char *)&local_30);
  iVar3 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar4 = (this->left).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(undefined8 *)&pnVar4[iVar3].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar4[iVar3].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar4[iVar3].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)puVar1;
  uVar9 = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar4[iVar3].m_backend.data + 0x20);
  uVar10 = *(undefined8 *)puVar1;
  uVar11 = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar4[iVar3].m_backend.data + 0x30);
  uVar12 = *(undefined8 *)(puVar1 + 2);
  puVar2 = (uint *)((long)&pnVar4[iVar14].m_backend.data + 0x30);
  *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
  *(undefined8 *)(puVar2 + 2) = uVar12;
  puVar1 = (uint *)((long)&pnVar4[iVar14].m_backend.data + 0x20);
  *(undefined8 *)puVar1 = uVar10;
  *(undefined8 *)(puVar1 + 2) = uVar11;
  puVar1 = (uint *)((long)&pnVar4[iVar14].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = uVar8;
  *(undefined8 *)(puVar1 + 2) = uVar9;
  *(undefined8 *)&pnVar4[iVar14].m_backend.data = uVar6;
  *(undefined8 *)((long)&pnVar4[iVar14].m_backend.data + 8) = uVar7;
  pnVar4[iVar14].m_backend.exp = pnVar4[iVar3].m_backend.exp;
  pnVar4[iVar14].m_backend.neg = pnVar4[iVar3].m_backend.neg;
  iVar13 = pnVar4[iVar3].m_backend.prec_elem;
  pnVar4[iVar14].m_backend.fpclass = pnVar4[iVar3].m_backend.fpclass;
  pnVar4[iVar14].m_backend.prec_elem = iVar13;
  iVar3 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar4 = (this->right).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(undefined8 *)&pnVar4[iVar3].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar4[iVar3].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar4[iVar3].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)puVar1;
  uVar9 = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar4[iVar3].m_backend.data + 0x20);
  uVar10 = *(undefined8 *)puVar1;
  uVar11 = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar4[iVar3].m_backend.data + 0x30);
  uVar12 = *(undefined8 *)(puVar1 + 2);
  puVar2 = (uint *)((long)&pnVar4[iVar14].m_backend.data + 0x30);
  *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
  *(undefined8 *)(puVar2 + 2) = uVar12;
  puVar1 = (uint *)((long)&pnVar4[iVar14].m_backend.data + 0x20);
  *(undefined8 *)puVar1 = uVar10;
  *(undefined8 *)(puVar1 + 2) = uVar11;
  puVar1 = (uint *)((long)&pnVar4[iVar14].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = uVar8;
  *(undefined8 *)(puVar1 + 2) = uVar9;
  *(undefined8 *)&pnVar4[iVar14].m_backend.data = uVar6;
  *(undefined8 *)((long)&pnVar4[iVar14].m_backend.data + 8) = uVar7;
  pnVar4[iVar14].m_backend.exp = pnVar4[iVar3].m_backend.exp;
  pnVar4[iVar14].m_backend.neg = pnVar4[iVar3].m_backend.neg;
  iVar13 = pnVar4[iVar3].m_backend.prec_elem;
  pnVar4[iVar14].m_backend.fpclass = pnVar4[iVar3].m_backend.fpclass;
  pnVar4[iVar14].m_backend.prec_elem = iVar13;
  iVar3 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar4 = (this->object).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(undefined8 *)&pnVar4[iVar3].m_backend.data;
  uVar7 = *(undefined8 *)((long)&pnVar4[iVar3].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar4[iVar3].m_backend.data + 0x10);
  uVar8 = *(undefined8 *)puVar1;
  uVar9 = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar4[iVar3].m_backend.data + 0x20);
  uVar10 = *(undefined8 *)puVar1;
  uVar11 = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)&pnVar4[iVar3].m_backend.data + 0x30);
  uVar12 = *(undefined8 *)(puVar1 + 2);
  puVar2 = (uint *)((long)&pnVar4[iVar14].m_backend.data + 0x30);
  *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
  *(undefined8 *)(puVar2 + 2) = uVar12;
  puVar1 = (uint *)((long)&pnVar4[iVar14].m_backend.data + 0x20);
  *(undefined8 *)puVar1 = uVar10;
  *(undefined8 *)(puVar1 + 2) = uVar11;
  puVar1 = (uint *)((long)&pnVar4[iVar14].m_backend.data + 0x10);
  *(undefined8 *)puVar1 = uVar8;
  *(undefined8 *)(puVar1 + 2) = uVar9;
  *(undefined8 *)&pnVar4[iVar14].m_backend.data = uVar6;
  *(undefined8 *)((long)&pnVar4[iVar14].m_backend.data + 8) = uVar7;
  pnVar4[iVar14].m_backend.exp = pnVar4[iVar3].m_backend.exp;
  pnVar4[iVar14].m_backend.neg = pnVar4[iVar3].m_backend.neg;
  iVar13 = pnVar4[iVar3].m_backend.prec_elem;
  pnVar4[iVar14].m_backend.fpclass = pnVar4[iVar3].m_backend.fpclass;
  pnVar4[iVar14].m_backend.prec_elem = iVar13;
  piVar5 = (this->scaleExp).data;
  piVar5[iVar14] =
       piVar5[(this->
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).set.thenum];
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->left,
          (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->right,
          (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum,true);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim(&this->object,
          (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum,true);
  DataArray<int>::reSize
            (&this->scaleExp,
             (this->
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).set.thenum);
  return extraout_EAX;
}

Assistant:

void remove(int i)
   {
      SVSetBase<R>::remove(i);
      left[i] = left[num()];
      right[i] = right[num()];
      object[i] = object[num()];
      scaleExp[i] = scaleExp[num()];
      left.reDim(num());
      right.reDim(num());
      object.reDim(num());
      scaleExp.reSize(num());
   }